

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int make_rgb_colormap(png_image_read_control *display)

{
  int iVar1;
  png_uint_32 ip;
  uint g;
  int iVar2;
  png_uint_32 blue;
  
  ip = 0;
  for (iVar1 = 0; iVar1 != 6; iVar1 = iVar1 + 1) {
    for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 1) {
      for (blue = 0; blue != 0x132; blue = blue + 0x33) {
        png_create_colormap_entry(display,ip,iVar1 * 0x33,iVar2 * 0x33,blue,0xff,1);
        ip = ip + 1;
      }
    }
  }
  return ip;
}

Assistant:

static int
make_rgb_colormap(png_image_read_control *display)
{
   unsigned int i, r;

   /* Build a 6x6x6 opaque RGB cube */
   for (i=r=0; r<6; ++r)
   {
      unsigned int g;

      for (g=0; g<6; ++g)
      {
         unsigned int b;

         for (b=0; b<6; ++b)
            png_create_colormap_entry(display, i++, r*51, g*51, b*51, 255,
                P_sRGB);
      }
   }

   return (int)i;
}